

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::pragma_t::set_pragma<int>(pragma_t *this,string *name,int *value,sqlite3 *db)

{
  int __v;
  ostream *poVar1;
  undefined8 uVar2;
  error_category *__cat;
  sqlite3 *in_RCX;
  int *in_RDX;
  string *in_RSI;
  int rc;
  __string_type query;
  stringstream ss;
  connection_ref con;
  function<sqlite_orm::internal::connection_ref_()> *in_stack_fffffffffffffdc8;
  error_code local_1f8;
  int local_1e4;
  string local_1e0 [24];
  char *in_stack_fffffffffffffe38;
  system_error *in_stack_fffffffffffffe40;
  error_code in_stack_fffffffffffffe48;
  sqlite3 *local_20;
  
  std::function<sqlite_orm::internal::connection_ref_()>::operator()(in_stack_fffffffffffffdc8);
  local_20 = in_RCX;
  if (in_RCX == (sqlite3 *)0x0) {
    local_20 = internal::connection_ref::get((connection_ref *)0x21e3b8);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe40);
  poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe50,"PRAGMA ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," = ");
  std::ostream::operator<<(poVar1,*in_RDX);
  std::__cxx11::stringstream::str();
  uVar2 = std::__cxx11::string::c_str();
  local_1e4 = sqlite3_exec(local_20,uVar2,0,0);
  if (local_1e4 != 0) {
    uVar2 = __cxa_allocate_exception(0x20);
    __v = sqlite3_errcode(local_20);
    __cat = &get_sqlite_error_category()->super_error_category;
    std::error_code::error_code(&local_1f8,__v,__cat);
    sqlite3_errmsg(local_20);
    std::system_error::system_error
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe38);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe40);
  internal::connection_ref::~connection_ref((connection_ref *)0x21e5a7);
  return;
}

Assistant:

void set_pragma(const std::string &name, const T &value, sqlite3 *db = nullptr) {
        auto con = this->get_connection();
        if(!db) {
            db = con.get();
        }
        std::stringstream ss;
        ss << "PRAGMA " << name << " = " << value;
        auto query = ss.str();
        auto rc = sqlite3_exec(db, query.c_str(), nullptr, nullptr, nullptr);
        if(rc != SQLITE_OK) {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }